

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,BlockVariable *var)

{
  QLatin1StringView t;
  bool bVar1;
  QList<QShaderDescription::BlockVariable> *vec;
  QDebug *pQVar2;
  char *in_RDX;
  QByteArray *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QDebugStateSaver saver;
  Stream *this;
  QDebug *in_stack_ffffffffffffffa8;
  QDebug *this_00;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  QDebug local_20;
  QDebug local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  vec = (QList<QShaderDescription::BlockVariable> *)
        QDebug::operator<<(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffd8.stream);
  QVar3 = typeStr((VariableType)((ulong)in_RSI >> 0x20));
  this_00 = (QDebug *)QVar3.m_size;
  t.m_data = in_RDX;
  t.m_size = (qsizetype)QVar3.m_data;
  QDebug::operator<<(this_00,t);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::operator<<((QDebug *)vec,in_RSI);
  if (*(int *)(in_RDX + 0x1c) != -1) {
    QDebug::nospace((QDebug *)in_RSI);
    QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::operator<<((QDebug *)this,(int)((ulong)in_RDI >> 0x20));
  }
  QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
  QDebug::operator<<((QDebug *)this,(int)((ulong)in_RDI >> 0x20));
  bVar1 = QList<int>::isEmpty((QList<int> *)0x6df2ca);
  if (!bVar1) {
    QDebug::nospace((QDebug *)in_RSI);
    pQVar2 = QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::QDebug(&local_20,pQVar2);
    operator<<(this_00,(QList<int> *)vec);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug(&local_20);
  }
  if (*(int *)(in_RDX + 0x40) != 0) {
    QDebug::nospace((QDebug *)in_RSI);
    QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::operator<<((QDebug *)this,(int)((ulong)in_RDI >> 0x20));
  }
  if (*(int *)(in_RDX + 0x44) != 0) {
    QDebug::nospace((QDebug *)in_RSI);
    QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::operator<<((QDebug *)this,(int)((ulong)in_RDI >> 0x20));
  }
  if ((in_RDX[0x48] & 1U) != 0) {
    QDebug::nospace((QDebug *)in_RSI);
    QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
  }
  bVar1 = QList<QShaderDescription::BlockVariable>::isEmpty
                    ((QList<QShaderDescription::BlockVariable> *)0x6df3ba);
  if (!bVar1) {
    QDebug::nospace((QDebug *)in_RSI);
    pQVar2 = QDebug::operator<<(this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::QDebug(&local_30,pQVar2);
    operator<<(this_00,vec);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
  }
  QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::BlockVariable &var)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "BlockVariable(" << typeStr(var.type) << ' ' << var.name;
    if (var.offset != -1)
        dbg.nospace() << " offset=" << var.offset;
    dbg.nospace() << " size=" << var.size;
    if (!var.arrayDims.isEmpty())
        dbg.nospace() << " array=" << var.arrayDims;
    if (var.arrayStride)
        dbg.nospace() << " arrayStride=" << var.arrayStride;
    if (var.matrixStride)
        dbg.nospace() << " matrixStride=" << var.matrixStride;
    if (var.matrixIsRowMajor)
        dbg.nospace() << " [rowmaj]";
    if (!var.structMembers.isEmpty())
        dbg.nospace() << " structMembers=" << var.structMembers;
    dbg.nospace() << ')';
    return dbg;
}